

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

bool __thiscall soplex::SoPlexBase<double>::_reapplyPersistentScaling(SoPlexBase<double> *this)

{
  return this->_optimizeCalls < 0xb ||
         (double)this->_unscaleCalls <= (double)this->_optimizeCalls * 0.1;
}

Assistant:

bool SoPlexBase<R>::_reapplyPersistentScaling() const
{
   if((_unscaleCalls > _optimizeCalls * SOPLEX_ALLOWED_UNSCALE_PERCENTAGE)
         && _optimizeCalls > SOPLEX_MIN_OPT_CALLS_WITH_SCALING)
      return false;
   else
      return true;
}